

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_property.c
# Opt level: O0

void mpt_text_init(mpt_text *tx,mpt_text *from)

{
  char *pcVar1;
  mpt_text *from_local;
  mpt_text *tx_local;
  
  if (from == (mpt_text *)0x0) {
    memcpy(tx,&def_text,0x28);
  }
  else {
    memcpy(tx,from,0x28);
    if (from->_font != (char *)0x0) {
      pcVar1 = strdup(from->_font);
      tx->_font = pcVar1;
    }
    if (from->_value != (char *)0x0) {
      pcVar1 = strdup(from->_value);
      tx->_value = pcVar1;
    }
  }
  return;
}

Assistant:

extern void mpt_text_init(MPT_STRUCT(text) *tx, const MPT_STRUCT(text) *from)
{
	if (from) {
		*tx = *from;
		
		if (from->_font) tx->_font = strdup(from->_font);
		if (from->_value) tx->_value = strdup(from->_value);
		
		return;
	}
	*tx = def_text;
}